

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O3

int ssl_check_server_ecdh_params(mbedtls_ssl_context *ssl)

{
  int iVar1;
  mbedtls_ecp_curve_info *pmVar2;
  
  pmVar2 = mbedtls_ecp_curve_info_from_grp_id((ssl->handshake->ecdh_ctx).curve);
  if (pmVar2 == (mbedtls_ecp_curve_info *)0x0) {
    iVar1 = -0x6c00;
  }
  else {
    iVar1 = mbedtls_ssl_check_curve(ssl,(ssl->handshake->ecdh_ctx).curve);
    iVar1 = -(uint)(iVar1 != 0);
  }
  return iVar1;
}

Assistant:

static int ssl_check_server_ecdh_params( const mbedtls_ssl_context *ssl )
{
    const mbedtls_ecp_curve_info *curve_info;
    curve_info = mbedtls_ecp_curve_info_from_grp_id( ssl->handshake->ecdh_ctx.curve );
    if( curve_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "ECDH curve: %s", curve_info->name ) );

#if defined(MBEDTLS_ECP_C)
    if( mbedtls_ssl_check_curve( ssl, ssl->handshake->ecdh_ctx.curve ) != 0 )
#else
    if( curve_info->bit_size < 163 || curve_info->bit_size > 521 )
#endif
        return( -1 );

    return( 0 );
}